

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O1

ByteData *
cfd::core::CryptoUtil::EncryptAes256(ByteData *__return_storage_ptr__,ByteData *key,ByteData *data)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  CfdException *pCVar4;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> value_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_data;
  undefined1 local_b0 [36];
  int local_8c;
  uchar *local_88;
  long local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  sVar2 = ByteData::GetDataSize(key);
  if (sVar2 != 0x20) {
    local_b0._0_8_ = "cfdcore_util.cpp";
    local_b0._8_4_ = 0x240;
    local_b0._16_8_ = "EncryptAes256";
    logger::log<>((CfdSourceLocation *)local_b0,kCfdLogLevelWarning,"wally_aes key size NG.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_b0._0_8_ = local_b0 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,"EncryptAes256Cbc key size error.","");
    CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)local_b0);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar1 = ByteData::IsEmpty(data);
  if (!bVar1) {
    sVar2 = ByteData::GetDataSize(data);
    sVar3 = ByteData::GetDataSize(data);
    if ((sVar3 & 0xf) != 0) {
      sVar2 = ByteData::GetDataSize(data);
      sVar2 = (sVar2 & 0xfffffffffffffff0) + 0x10;
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70,sVar2,
               (allocator_type *)local_b0);
    ByteData::GetBytes(&local_40,key);
    ByteData::GetBytes(&local_58,data);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88,sVar2,
               (allocator_type *)local_b0);
    memcpy(local_88,local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
           (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
    local_8c = wally_aes(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         (long)local_40.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_40.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,local_88,
                         local_80 - (long)local_88,1,
                         local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         (long)local_70.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_70.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
    if (local_8c == 0) {
      ByteData::ByteData(__return_storage_ptr__,&local_70);
      if (local_88 != (uchar *)0x0) {
        operator_delete(local_88);
      }
      if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
    local_b0._0_8_ = "cfdcore_util.cpp";
    local_b0._8_4_ = 0x25d;
    local_b0._16_8_ = "EncryptAes256";
    logger::log<int&>((CfdSourceLocation *)local_b0,kCfdLogLevelWarning,"wally_aes NG[{}].",
                      &local_8c);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_b0._0_8_ = local_b0 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"EncryptAes256 error.","");
    CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)local_b0);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_b0._0_8_ = "cfdcore_util.cpp";
  local_b0._8_4_ = 0x246;
  local_b0._16_8_ = "EncryptAes256";
  logger::log<>((CfdSourceLocation *)local_b0,kCfdLogLevelWarning,"wally_aes data is Empty.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_b0._0_8_ = local_b0 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,"EncryptAes256Cbc data isEmpty.","");
  CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)local_b0);
  __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData CryptoUtil::EncryptAes256(const ByteData &key, const ByteData &data) {
  if (key.GetDataSize() != AES_KEY_LEN_256) {
    warn(CFD_LOG_SOURCE, "wally_aes key size NG.");
    throw CfdException(
        kCfdIllegalStateError, "EncryptAes256Cbc key size error.");
  }

  if (data.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "wally_aes data is Empty.");
    throw CfdException(
        kCfdIllegalStateError, "EncryptAes256Cbc data isEmpty.");
  }

  size_t data_size = data.GetDataSize();
  if (data.GetDataSize() % kAesBlockLength != 0) {
    data_size = ((data.GetDataSize() / kAesBlockLength) + 1) * kAesBlockLength;
  }
  std::vector<uint8_t> output(data_size);
  std::vector<uint8_t> key_data = key.GetBytes();
  std::vector<uint8_t> value_data = data.GetBytes();
  std::vector<uint8_t> input(data_size);
  // To fill the end with 0
  memcpy(
      input.data(), reinterpret_cast<const uint8_t *>(value_data.data()),
      value_data.size());

  // Encrypt data using AES (ECB mode, no padding).
  int ret = wally_aes(
      key_data.data(), key_data.size(), input.data(), input.size(),
      AES_FLAG_ENCRYPT, output.data(), output.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_aes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "EncryptAes256 error.");
  }

  return ByteData(output);
}